

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFAcroFormDocumentHelper::removeFormFields
          (QPDFAcroFormDocumentHelper *this,
          set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *to_remove)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  int iVar4;
  element_type *peVar5;
  pointer ppVar6;
  reference pQVar7;
  pointer ppVar8;
  mapped_type *pmVar9;
  size_type sVar10;
  QPDFObjGen local_170;
  undefined1 local_168 [8];
  QPDFObjectHandle field;
  iterator iStack_150;
  int i;
  _Self local_148;
  iterator name;
  QPDFObjGen local_130;
  undefined1 local_128 [8];
  QPDFAnnotationObjectHelper aoh;
  iterator __end3;
  iterator __begin3;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *__range3;
  _Self local_d0;
  iterator annotations;
  QPDFObjGen *og;
  iterator __end1;
  iterator __begin1;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *__range1;
  string local_a0 [32];
  undefined1 local_80 [8];
  QPDFObjectHandle fields;
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [24];
  QPDFObjectHandle acroform;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *to_remove_local;
  QPDFAcroFormDocumentHelper *this_local;
  
  acroform.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)to_remove;
  QPDF::getRoot((QPDF *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/AcroForm",&local_59);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_38 + 0x10),(string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
  bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_38 + 0x10));
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_a0,"/Fields",(allocator<char> *)((long)&__range1 + 7));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_80,(string *)(local_38 + 0x10));
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    bVar3 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_80);
    _Var2 = acroform.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
    if (bVar3) {
      __end1 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::begin
                         ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                          acroform.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi);
      og = (QPDFObjGen *)
           std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::end
                     ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                      _Var2._M_pi);
      while (bVar3 = std::operator!=(&__end1,(_Self *)&og), bVar3) {
        annotations._M_node =
             (_Base_ptr)std::_Rb_tree_const_iterator<QPDFObjGen>::operator*(&__end1);
        peVar5 = std::
                 __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m);
        local_d0._M_node =
             (_Base_ptr)
             std::
             map<QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
             ::find(&peVar5->field_to_annotations,annotations._M_node);
        peVar5 = std::
                 __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m);
        __range3 = (vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
                    *)std::
                      map<QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
                      ::end(&peVar5->field_to_annotations);
        bVar3 = std::operator!=(&local_d0,(_Self *)&__range3);
        if (bVar3) {
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>
                   ::operator->(&local_d0);
          __end3 = std::
                   vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::
                   begin(&ppVar6->second);
          aoh.m.super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
               ::end(&ppVar6->second);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
                                             *)&aoh.m.
                                                super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount), bVar3) {
            pQVar7 = __gnu_cxx::
                     __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
                     ::operator*(&__end3);
            QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper
                      ((QPDFAnnotationObjectHelper *)local_128,pQVar7);
            peVar5 = std::
                     __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m);
            QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&name);
            local_130 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&name);
            std::
            map<QPDFObjGen,_QPDFFormFieldObjectHelper,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
            ::erase(&peVar5->annotation_to_field,&local_130);
            QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&name);
            QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper
                      ((QPDFAnnotationObjectHelper *)local_128);
            __gnu_cxx::
            __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
            ::operator++(&__end3);
          }
          peVar5 = std::
                   __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->m);
          std::
          map<QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
          ::erase(&peVar5->field_to_annotations,(key_type *)annotations._M_node);
        }
        peVar5 = std::
                 __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m);
        local_148._M_node =
             (_Base_ptr)
             std::
             map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&peVar5->field_to_name,annotations._M_node);
        peVar5 = std::
                 __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m);
        iStack_150 = std::
                     map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::end(&peVar5->field_to_name);
        bVar3 = std::operator!=(&local_148,&stack0xfffffffffffffeb0);
        if (bVar3) {
          peVar5 = std::
                   __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->m);
          ppVar8 = std::
                   _Rb_tree_iterator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->(&local_148);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                   ::operator[](&peVar5->name_to_fields,&ppVar8->second);
          std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::erase
                    (pmVar9,(key_type *)annotations._M_node);
          peVar5 = std::
                   __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->m);
          ppVar8 = std::
                   _Rb_tree_iterator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->(&local_148);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                   ::operator[](&peVar5->name_to_fields,&ppVar8->second);
          bVar3 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::empty
                            (pmVar9);
          if (bVar3) {
            peVar5 = std::
                     __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m);
            ppVar8 = std::
                     _Rb_tree_iterator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator->(&local_148);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
            ::erase(&peVar5->name_to_fields,&ppVar8->second);
          }
          peVar5 = std::
                   __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->m);
          std::
          map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::erase(&peVar5->field_to_name,(key_type *)annotations._M_node);
        }
        std::_Rb_tree_const_iterator<QPDFObjGen>::operator++(&__end1);
      }
      field.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = 0;
      while (iVar1 = field.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                     _4_4_, iVar4 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_80),
            iVar1 < iVar4) {
        QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_168,(int)local_80);
        _Var2 = acroform.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        local_170 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_168);
        sVar10 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::count
                           ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                            _Var2._M_pi,&local_170);
        if (sVar10 == 0) {
          field.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ =
               field.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi._4_4_ + 1;
        }
        else {
          QPDFObjectHandle::eraseItem
                    ((QPDFObjectHandle *)local_80,
                     field.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                     _4_4_);
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_168);
      }
      fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ = 0;
    }
    else {
      fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ = 1;
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_80);
  }
  else {
    fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = 1;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_38 + 0x10));
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::removeFormFields(std::set<QPDFObjGen> const& to_remove)
{
    auto acroform = qpdf.getRoot().getKey("/AcroForm");
    if (!acroform.isDictionary()) {
        return;
    }
    auto fields = acroform.getKey("/Fields");
    if (!fields.isArray()) {
        return;
    }

    for (auto const& og: to_remove) {
        auto annotations = m->field_to_annotations.find(og);
        if (annotations != m->field_to_annotations.end()) {
            for (auto aoh: annotations->second) {
                m->annotation_to_field.erase(aoh.getObjectHandle().getObjGen());
            }
            m->field_to_annotations.erase(og);
        }
        auto name = m->field_to_name.find(og);
        if (name != m->field_to_name.end()) {
            m->name_to_fields[name->second].erase(og);
            if (m->name_to_fields[name->second].empty()) {
                m->name_to_fields.erase(name->second);
            }
            m->field_to_name.erase(og);
        }
    }

    int i = 0;
    while (i < fields.getArrayNItems()) {
        auto field = fields.getArrayItem(i);
        if (to_remove.count(field.getObjGen())) {
            fields.eraseItem(i);
        } else {
            ++i;
        }
    }
}